

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HumanDetector.cpp
# Opt level: O3

vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> * __thiscall
HumanDetector::detectHuman
          (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *__return_storage_ptr__,
          HumanDetector *this,Mat *image)

{
  IDescriptor *pIVar1;
  ostream *poVar2;
  Mat local_80 [96];
  
  pIVar1 = this->descriptor;
  cv::Mat::Mat(local_80,image);
  (**pIVar1->_vptr_IDescriptor)(__return_storage_ptr__,pIVar1,local_80);
  cv::Mat::~Mat(local_80);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of humans detected: ",0x1b);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::Rect> HumanDetector::detectHuman(cv::Mat image) {
  // delegate to helper class
  std::vector<cv::Rect> found = descriptor->detect(image);
  std::cout << "Number of humans detected: " << found.size() << std::endl;
  return found;
}